

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_utils.cpp
# Opt level: O1

void CS248::checkGLError(string *str,bool abort_program_if_error)

{
  int iVar1;
  ostream *poVar2;
  char *__s;
  size_t sVar3;
  byte bVar4;
  
  bVar4 = 0;
  do {
    iVar1 = glGetError();
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"*** GL error:",0xd);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(str->_M_dataplus)._M_p,str->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," : ",3);
      __s = (char *)gluErrorString(iVar1);
      if (__s == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar3);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      bVar4 = 1;
    }
  } while (iVar1 != 0);
  if ((bVar4 & abort_program_if_error) != 1) {
    return;
  }
  exit(1);
}

Assistant:

void checkGLError(const std::string& str, bool abort_program_if_error) {
  GLenum err;
  bool has_error = false;
  do {
    err = glGetError();
    if (err != GL_NO_ERROR) {
       cerr << "*** GL error:" << str << " : " << gluErrorString(err) << endl;
       has_error = true;
	  }
  } while (err != GL_NO_ERROR);
  if (has_error && abort_program_if_error) {
    exit(1);
  }
}